

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTestPackage.cpp
# Opt level: O0

int __thiscall es31cts::TestCaseWrapper::init(TestCaseWrapper *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  string *param_2_local;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  pCVar2 = deqp::TestPackage::getContext(&this->m_testPackage->super_TestPackage);
  renderCtx = deqp::Context::getRenderContext(pCVar2);
  pCVar2 = deqp::TestPackage::getContext(&this->m_testPackage->super_TestPackage);
  ctxInfo = deqp::Context::getContextInfo(pCVar2);
  glu::resetState(renderCtx,ctxInfo);
  iVar1 = (**(code **)(*(long *)ctx + 0x10))();
  return iVar1;
}

Assistant:

void TestCaseWrapper::init(tcu::TestCase* testCase, const std::string&)
{
	glu::resetState(m_testPackage.getContext().getRenderContext(), m_testPackage.getContext().getContextInfo());

	testCase->init();
}